

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

uchar * cJSON_strdup(uchar *string,internal_hooks *hooks)

{
  size_t sVar1;
  void *__dest;
  uchar *puVar2;
  
  if (string != (uchar *)0x0) {
    sVar1 = strlen((char *)string);
    __dest = (*global_hooks.allocate)(sVar1 + 1);
    if (__dest != (void *)0x0) {
      puVar2 = (uchar *)memcpy(__dest,string,sVar1 + 1);
      return puVar2;
    }
  }
  return (uchar *)0x0;
}

Assistant:

static unsigned char* cJSON_strdup(const unsigned char* string, const internal_hooks * const hooks)
{
    size_t length = 0;
    unsigned char *copy = NULL;

    if (string == NULL)
    {
        return NULL;
    }

    length = strlen((const char*)string) + sizeof("");
    copy = (unsigned char*)hooks->allocate(length);
    if (copy == NULL)
    {
        return NULL;
    }
    memcpy(copy, string, length);

    return copy;
}